

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O1

string * __thiscall
GenexEvaluator::EvaluateExpression
          (string *__return_storage_ptr__,GenexEvaluator *this,string *genexOperator,
          string *expression,cmGeneratorExpressionContext *context,
          GeneratorExpressionContent *content,cmGeneratorExpressionDAGChecker *dagCheckerParent)

{
  cmGeneratorTarget *target;
  pointer pcVar1;
  Result RVar2;
  long *plVar3;
  size_type *psVar4;
  cmGeneratorExpressionDAGChecker dagChecker;
  string local_100;
  cmListFileBacktrace local_e0;
  string local_d0;
  cmGeneratorExpressionDAGChecker local_b0;
  
  if (context->HeadTarget == (cmGeneratorTarget *)0x0) {
    cmGeneratorExpressionNode::EvaluateDependentExpression
              (__return_storage_ptr__,expression,context->LG,context,(cmGeneratorTarget *)0x0,
               dagCheckerParent,context->CurrentTarget);
  }
  else {
    local_e0.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (context->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
              TopEntry.
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    local_e0.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi =
         (context->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
         super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    if (local_e0.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_e0.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
         super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi)->_M_use_count =
             (local_e0.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_e0.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
         super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi)->_M_use_count =
             (local_e0.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    target = context->HeadTarget;
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    pcVar1 = (genexOperator->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_100,pcVar1,pcVar1 + genexOperator->_M_string_length);
    std::__cxx11::string::append((char *)&local_100);
    plVar3 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_100,(ulong)(expression->_M_dataplus)._M_p);
    psVar4 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar4) {
      local_d0.field_2._M_allocated_capacity = *psVar4;
      local_d0.field_2._8_8_ = plVar3[3];
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    }
    else {
      local_d0.field_2._M_allocated_capacity = *psVar4;
      local_d0._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_d0._M_string_length = plVar3[1];
    *plVar3 = (long)psVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
              (&local_b0,&local_e0,target,&local_d0,content,dagCheckerParent);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    if (local_e0.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_e0.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                 super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    RVar2 = cmGeneratorExpressionDAGChecker::Check(&local_b0);
    if (RVar2 - SELF_REFERENCE < 2) {
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_100,content);
      cmGeneratorExpressionDAGChecker::ReportError(&local_b0,context,&local_100);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    }
    else {
      cmGeneratorExpressionNode::EvaluateDependentExpression
                (__return_storage_ptr__,expression,context->LG,context,context->HeadTarget,&local_b0
                 ,context->CurrentTarget);
    }
    if (local_b0.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_b0.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                 TopEntry.
                 super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    std::
    _Rb_tree<const_cmGeneratorTarget_*,_std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::~_Rb_tree(&local_b0.Seen._M_t);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.Property._M_dataplus._M_p != &local_b0.Property.field_2) {
      operator_delete(local_b0.Property._M_dataplus._M_p,
                      local_b0.Property.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string EvaluateExpression(
    const std::string& genexOperator, const std::string& expression,
    cmGeneratorExpressionContext* context,
    const GeneratorExpressionContent* content,
    cmGeneratorExpressionDAGChecker* dagCheckerParent) const
  {
    if (context->HeadTarget) {
      cmGeneratorExpressionDAGChecker dagChecker(
        context->Backtrace, context->HeadTarget,
        genexOperator + ":" + expression, content, dagCheckerParent);
      switch (dagChecker.Check()) {
        case cmGeneratorExpressionDAGChecker::SELF_REFERENCE:
        case cmGeneratorExpressionDAGChecker::CYCLIC_REFERENCE: {
          dagChecker.ReportError(context, content->GetOriginalExpression());
          return std::string();
        }
        case cmGeneratorExpressionDAGChecker::ALREADY_SEEN:
        case cmGeneratorExpressionDAGChecker::DAG:
          break;
      }

      return this->EvaluateDependentExpression(
        expression, context->LG, context, context->HeadTarget, &dagChecker,
        context->CurrentTarget);
    }

    return this->EvaluateDependentExpression(
      expression, context->LG, context, context->HeadTarget, dagCheckerParent,
      context->CurrentTarget);
  }